

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triplets-or-quads-recognizer.cpp
# Opt level: O0

void __thiscall
mahjong::TripletsOrQuadsRecognizer::check(TripletsOrQuadsRecognizer *this,Meld *meld)

{
  bool bVar1;
  Tile tile;
  Meld *meld_local;
  TripletsOrQuadsRecognizer *this_local;
  
  bVar1 = Meld::isTripletOrQuad(meld);
  if (bVar1) {
    bVar1 = Meld::isQuad(meld);
    if (bVar1) {
      this->quad_count = this->quad_count + 1;
    }
    bVar1 = Meld::isTriplet(meld);
    if (bVar1) {
      this->triplet_count = this->triplet_count + 1;
    }
    bVar1 = Meld::isOpen(meld);
    if (!bVar1) {
      this->closed_triplet_or_quad_count = this->closed_triplet_or_quad_count + 1;
    }
  }
  bVar1 = WiningState::isWinByDiscard((this->super_PatternRecognizer).state);
  if ((bVar1) && (bVar1 = Meld::isOpen(meld), !bVar1)) {
    tile = PlayerHand::lastTile((this->super_PatternRecognizer).hand);
    bVar1 = Meld::isContain(meld,tile);
    if (bVar1) {
      bVar1 = Meld::isSequence(meld);
      if (bVar1) {
        this->closed_count_modifier = this->closed_count_modifier + 1;
      }
      else {
        this->closed_count_modifier = this->closed_count_modifier + -1;
      }
    }
  }
  return;
}

Assistant:

void TripletsOrQuadsRecognizer::check(const Meld& meld)
{
	if (meld.isTripletOrQuad())
	{
		if (meld.isQuad())
		{
			quad_count++;
		}

		if (meld.isTriplet())
		{
			triplet_count++;
		}

		if (!meld.isOpen())
		{
			closed_triplet_or_quad_count++;
		}
	}

	if (state.isWinByDiscard())
	{
		if (!meld.isOpen() && meld.isContain(hand.lastTile()))
		{
			if (meld.isSequence())
			{
				closed_count_modifier++;
			}
			else
			{
				closed_count_modifier--;
			}
		}
	}
}